

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O3

void __thiscall Refal2::CLeftPartCompiler::matchVE(CLeftPartCompiler *this,bool isRightDirection)

{
  CVariable *pCVar1;
  int iVar2;
  int iVar3;
  TVariableType TVar4;
  bool bVar5;
  undefined7 in_register_00000031;
  CQualifier *pCVar6;
  
  checkBorders(this);
  iVar2 = (this->super_CFunctionCompilerBase).variables.variablesSize;
  if ((int)CONCAT71(in_register_00000031,isRightDirection) == 0) {
    iVar3 = (((this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.first)->
            super_CUnit).field_1.variable;
    if ((-1 < (long)iVar3) && (iVar3 < iVar2)) {
      pCVar1 = (this->super_CFunctionCompilerBase).variables.variables + iVar3;
      pCVar6 = &pCVar1->qualifier;
      TVar4 = pCVar1->type;
      bVar5 = setVariable(this,iVar3);
      if (TVar4 == VT_E) {
        COperationsBuilder::AddMatchLeft_E((COperationsBuilder *)this,pCVar6,bVar5);
      }
      else {
        COperationsBuilder::AddMatchLeft_V((COperationsBuilder *)this,pCVar6,bVar5);
      }
      CNodeList<Refal2::CUnit>::RemoveFirst((CNodeList<Refal2::CUnit> *)this->hole);
      return;
    }
  }
  else {
    iVar3 = (((this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last)->
            super_CUnit).field_1.variable;
    if ((-1 < (long)iVar3) && (iVar3 < iVar2)) {
      pCVar1 = (this->super_CFunctionCompilerBase).variables.variables + iVar3;
      pCVar6 = &pCVar1->qualifier;
      TVar4 = pCVar1->type;
      bVar5 = setVariable(this,iVar3);
      if (TVar4 == VT_E) {
        COperationsBuilder::AddMatchRight_E((COperationsBuilder *)this,pCVar6,bVar5);
      }
      else {
        COperationsBuilder::AddMatchRight_V((COperationsBuilder *)this,pCVar6,bVar5);
      }
      CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
      return;
    }
  }
  __assert_fail("IsValidVariableIndex( variableIndex )",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Variables.h"
                ,0x75,"CVariable &Refal2::CVariables::GetVariable(TVariableIndex)");
}

Assistant:

void CLeftPartCompiler::matchVE(const bool isRightDirection)
{
	checkBorders();
	if( isRightDirection ) {
		TVariableIndex variableIndex = hole->GetLast()->Variable();

		if( variables.GetVariable( variableIndex ).TypeIs( VT_E ) ) {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchRight_E );
		} else {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchRight_V );
		}

		hole->RemoveLast();
	} else {
		TVariableIndex variableIndex = hole->GetFirst()->Variable();

		if( variables.GetVariable( variableIndex ).TypeIs( VT_E ) ) {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchLeft_E );
		} else {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchLeft_V );
		}

		hole->RemoveFirst();
	}
}